

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::LoadBean::
act<hiberlite::AVisitor<hiberlite::LoadBean>,std::__cxx11::string,hiberlite::stl_stream_adapter<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (LoadBean *this,AVisitor<hiberlite::LoadBean> *av,
          collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *nvp)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  bool bVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  reference pvVar5;
  database_error *this_01;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [32];
  undefined1 local_2d0 [8];
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> el;
  string local_250 [32];
  undefined1 local_230 [24];
  SQLiteSelect sel;
  string local_1d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [8];
  string query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  size_t i;
  undefined1 local_e0 [24];
  vector<long_long,_std::allocator<long_long>_> children;
  undefined1 local_70 [8];
  string tab;
  string local_40 [32];
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_20;
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *nvp_local;
  AVisitor<hiberlite::LoadBean> *av_local;
  LoadBean *this_local;
  
  local_20 = nvp;
  nvp_local = (collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)av;
  av_local = (AVisitor<hiberlite::LoadBean> *)this;
  std::__cxx11::string::string(local_40,(string *)nvp);
  AVisitor<hiberlite::LoadBean>::diveTable(av,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  AVisitor<hiberlite::LoadBean>::getScope
            ((Scope *)&children.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
             (AVisitor<hiberlite::LoadBean> *)nvp_local);
  Scope::table_abi_cxx11_((Scope *)local_70);
  Scope::~Scope((Scope *)&children.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
  AVisitor<hiberlite::LoadBean>::getConnection((AVisitor<hiberlite::LoadBean> *)local_e0);
  std::__cxx11::string::string((string *)&i,(string *)local_70);
  pvVar3 = std::
           stack<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>_>
           ::top(&this->stmt);
  Database::dbSelectChildIds
            ((vector<long_long,_std::allocator<long_long>_> *)(local_e0 + 0x10),
             (shared_connection *)local_e0,(string *)&i,pvVar3->second);
  std::__cxx11::string::~string((string *)&i);
  shared_res<hiberlite::autoclosed_con>::~shared_res
            ((shared_res<hiberlite::autoclosed_con> *)local_e0);
  stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::startLoadFromDb(&nvp->stream);
  entry = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    pbVar1 = entry;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<long_long,_std::allocator<long_long>_>::size
                       ((vector<long_long,_std::allocator<long_long>_> *)(local_e0 + 0x10));
    if (pbVar4 <= pbVar1) {
      AVisitor<hiberlite::LoadBean>::pop((AVisitor<hiberlite::LoadBean> *)nvp_local);
      std::vector<long_long,_std::allocator<long_long>_>::~vector
                ((vector<long_long,_std::allocator<long_long>_> *)(local_e0 + 0x10));
      std::__cxx11::string::~string((string *)local_70);
      return;
    }
    construct<hiberlite::AVisitor<hiberlite::LoadBean>,std::__cxx11::string>
              ((AVisitor<hiberlite::LoadBean> *)nvp_local,&local_110,0);
    std::operator+((char *)local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "SELECT * FROM ");
    std::operator+(local_1b0,(char *)local_1d0);
    std::operator+(local_190,(char *)local_1b0);
    std::operator+(local_170,(char *)local_190);
    pvVar5 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       ((vector<long_long,_std::allocator<long_long>_> *)(local_e0 + 0x10),
                        (size_type)entry);
    Transformer::toSQLiteValue_abi_cxx11_((Transformer *)&sel.con.res,pvVar5);
    std::operator+(local_150,local_170);
    std::operator+(local_130,(char *)local_150);
    std::__cxx11::string::~string((string *)local_150);
    std::__cxx11::string::~string((string *)&sel.con.res);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string(local_1d0);
    AVisitor<hiberlite::LoadBean>::getConnection((AVisitor<hiberlite::LoadBean> *)local_230);
    std::__cxx11::string::string(local_250,(string *)local_130);
    SQLiteSelect::SQLiteSelect
              ((SQLiteSelect *)(local_230 + 0x10),(shared_connection *)local_230,(string *)local_250
              );
    std::__cxx11::string::~string(local_250);
    shared_res<hiberlite::autoclosed_con>::~shared_res
              ((shared_res<hiberlite::autoclosed_con> *)local_230);
    bVar2 = SQLiteSelect::step((SQLiteSelect *)(local_230 + 0x10));
    if (!bVar2) break;
    pvVar5 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       ((vector<long_long,_std::allocator<long_long>_> *)(local_e0 + 0x10),
                        (size_type)entry);
    std::make_pair<hiberlite::SQLiteSelect&,long_long&>
              ((pair<hiberlite::SQLiteSelect,_long_long> *)&el.field_0x40,
               (SQLiteSelect *)(local_230 + 0x10),pvVar5);
    std::
    stack<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>_>
    ::push(&this->stmt,(value_type *)&el.field_0x40);
    std::pair<hiberlite::SQLiteSelect,_long_long>::~pair
              ((pair<hiberlite::SQLiteSelect,_long_long> *)&el.field_0x40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f0,"item",&local_2f1);
    pbVar1 = local_110;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_318,"",&local_319);
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    sql_nvp((sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_2d0,(string *)local_2f0,pbVar1,(string *)local_318);
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    this_00 = nvp_local;
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    sql_nvp(&local_368,
            (sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_2d0);
    AVisitor<hiberlite::LoadBean>::operator&((AVisitor<hiberlite::LoadBean> *)this_00,&local_368);
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~sql_nvp(&local_368);
    std::
    stack<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>_>
    ::pop(&this->stmt);
    stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::putNext(&nvp->stream,local_110);
    destroy<hiberlite::LoadBean,std::__cxx11::string>(this,local_110,0);
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~sql_nvp((sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2d0);
    SQLiteSelect::~SQLiteSelect((SQLiteSelect *)(local_230 + 0x10));
    std::__cxx11::string::~string((string *)local_130);
    entry = entry + 1;
  }
  this_01 = (database_error *)__cxa_allocate_exception(0x10);
  database_error::database_error(this_01,"id not found in the database");
  __cxa_throw(this_01,&database_error::typeinfo,database_error::~database_error);
}

Assistant:

void LoadBean::act(AV& av, collection_nvp<E,S> nvp )
{
	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		std::vector<sqlid_t> children=Database::dbSelectChildIds(av.getConnection(), tab, stmt.top().second);
		nvp.stream.startLoadFromDb();

		for(size_t i=0;i<children.size();i++){
			E* entry;
			construct(av,&entry,static_cast<unsigned int>(0));

				std::string query="SELECT * FROM "+tab
								+" WHERE "+HIBERLITE_PRIMARY_KEY_COLUMN+"="+Transformer::toSQLiteValue(children[i])+";";
				SQLiteSelect sel(av.getConnection(), query);
				if(!sel.step())
					throw database_error("id not found in the database");
				stmt.push( std::make_pair(sel,children[i]) );

					sql_nvp<E> el("item", *entry);
					av & el;

				stmt.pop();
			nvp.stream.putNext(*entry);
			destroy(*this, entry, static_cast<unsigned int>(0));
		}
	av.pop();
}